

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_check_mandatory_data
              (lyd_node *root,lyd_node *last_parent,ly_set *instances,lys_node *schema,int options)

{
  LYS_NODE LVar1;
  uint uVar2;
  char *pcVar3;
  ly_set *elem;
  int iVar4;
  lys_node *plVar5;
  lys_module *plVar6;
  char *local_80;
  lys_node *local_60;
  int local_4c;
  uint32_t limit;
  int state;
  lyd_node *current;
  lyd_node *dummy;
  lys_node *plStack_30;
  int options_local;
  lys_node *schema_local;
  ly_set *instances_local;
  lyd_node *last_parent_local;
  lyd_node *root_local;
  
  dummy._4_4_ = options;
  plStack_30 = schema;
  schema_local = (lys_node *)instances;
  instances_local = (ly_set *)last_parent;
  last_parent_local = root;
  if (instances->number == 0) {
    plVar5 = lys_is_disabled(schema,2);
    if (plVar5 != (lys_node *)0x0) {
      return 0;
    }
    if (((dummy._4_4_ & 0x2000) != 0) ||
       (((dummy._4_4_ & 0xff) != 0 && ((plStack_30->flags & 2) != 0)))) {
      return 0;
    }
    if (((dummy._4_4_ & 0xff) == 0) || ((dummy._4_4_ & 0x71) != 0)) {
      if (instances_local == (ly_set *)0x0) {
        local_60 = (lys_node *)0x0;
      }
      else {
        local_60 = *(lys_node **)instances_local;
      }
      iVar4 = resolve_applies_when(plStack_30,1,local_60);
      if (iVar4 != 0) {
        current = lyd_new_dummy(last_parent_local,(lyd_node *)instances_local,plStack_30,(char *)0x0
                                ,0);
        if (current == (lyd_node *)0x0) {
          return 1;
        }
        if (current->parent == (lyd_node *)0x0) {
          lyd_insert_before(last_parent_local,current);
        }
        for (_limit = current; _limit != (lyd_node *)0x0; _limit = _limit->child) {
          ly_vlog_hide('\x01');
          resolve_when(_limit,&local_4c,0);
          ly_vlog_hide('\0');
          if (local_4c == 0) {
            lyd_free(current);
            ly_err_clean(1);
            return 0;
          }
          if ((_limit->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
          break;
        }
        lyd_free(current);
      }
    }
  }
  elem = instances_local;
  LVar1 = plStack_30->nodetype;
  if (LVar1 != LYS_LEAF) {
    if (LVar1 == LYS_LEAFLIST) {
      if ((*(uint *)&plStack_30[1].priv != 0) &&
         (*(uint *)((long)&schema_local->name + 4) < *(uint *)&plStack_30[1].priv)) {
        ly_vlog(LYE_NOMIN,LY_VLOG_LYD,instances_local,plStack_30->name);
        return 1;
      }
      uVar2 = *(uint *)((long)&plStack_30[1].priv + 4);
      if (uVar2 == 0) {
        return 0;
      }
      if (*(uint *)((long)&schema_local->name + 4) <= uVar2) {
        return 0;
      }
      ly_vlog(LYE_NOMAX,LY_VLOG_LYD,*(void **)(schema_local->dsc + (ulong)uVar2 * 8),
              plStack_30->name);
      return 1;
    }
    if (LVar1 == LYS_LIST) {
      if ((*(uint *)&plStack_30[1].iffeature != 0) &&
         (*(uint *)((long)&schema_local->name + 4) < *(uint *)&plStack_30[1].iffeature)) {
        ly_vlog(LYE_NOMIN,LY_VLOG_LYD,instances_local,plStack_30->name);
        return 1;
      }
      uVar2 = *(uint *)((long)&plStack_30[1].iffeature + 4);
      if (uVar2 == 0) {
        return 0;
      }
      if (*(uint *)((long)&schema_local->name + 4) <= uVar2) {
        return 0;
      }
      ly_vlog(LYE_NOMAX,LY_VLOG_LYD,*(void **)(schema_local->dsc + (ulong)uVar2 * 8),
              plStack_30->name);
      return 1;
    }
    if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0xab,
                    "int lyd_check_mandatory_data(struct lyd_node *, struct lyd_node *, struct ly_set *, struct lys_node *, int)"
                   );
    }
  }
  if (((plStack_30->flags & 0x40) != 0) && (*(int *)((long)&schema_local->name + 4) == 0)) {
    pcVar3 = plStack_30->name;
    if (instances_local == (ly_set *)0x0) {
      plVar6 = lys_node_module(plStack_30);
      local_80 = plVar6->name;
    }
    else {
      local_80 = (char *)**(undefined8 **)instances_local;
    }
    ly_vlog(LYE_MISSELEM,LY_VLOG_LYD,elem,pcVar3,local_80);
    return 1;
  }
  return 0;
}

Assistant:

static int
lyd_check_mandatory_data(struct lyd_node *root, struct lyd_node *last_parent,
                         struct ly_set *instances, struct lys_node *schema, int options)
{
    struct lyd_node *dummy, *current;
    int state;
    uint32_t limit;

    if (!instances->number) {
        /* no instance in the data tree - check if the instantiating is enabled
         * (check: if-feature, when, status data in non-status data tree)
         */
        if (lys_is_disabled(schema, 2)) {
            /* disabled by if-feature */
            return EXIT_SUCCESS;
        } else if ((options & LYD_OPT_TRUSTED) || ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R))) {
            /* status schema node in non-status data tree */
            return EXIT_SUCCESS;
        } else {
            if ((!(options & LYD_OPT_TYPEMASK) || (options & (LYD_OPT_CONFIG | LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)))
                    && resolve_applies_when(schema, 1, last_parent ? last_parent->schema : NULL)) {
                /* evaluate when statements */
                dummy = lyd_new_dummy(root, last_parent, schema, NULL, 0);
                if (!dummy) {
                    return EXIT_FAILURE;
                }
                if (!dummy->parent) {
                    /* connect dummy nodes into the data tree, insert it before the root
                     * to optimize later unlinking (lyd_free()) */
                    lyd_insert_before(root, dummy);
                }
                for (current = dummy; current; current = current->child) {
                    ly_vlog_hide(1);
                    resolve_when(current, &state, 0);
                    ly_vlog_hide(0);
                    if (!state) {
                        /* when evaluates to false */
                        lyd_free(dummy);
                        ly_err_clean(1);
                        return EXIT_SUCCESS;
                    }

                    if (current->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        /* termination node without a child */
                        break;
                    }
                }
                lyd_free(dummy);
            }
        }
        /* the schema instance is not disabled by anything, continue with checking */
    }

    /* checking various mandatory conditions */
    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* mandatory */
        if ((schema->flags & LYS_MAND_TRUE) && !instances->number) {
            LOGVAL(LYE_MISSELEM, LY_VLOG_LYD, last_parent, schema->name,
                   last_parent ? last_parent->schema->name : lys_node_module(schema)->name);
            return EXIT_FAILURE;
        }
        break;
    case LYS_LIST:
        /* min-elements */
        limit = ((struct lys_node_list *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_list *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }

        break;

    case LYS_LEAFLIST:
        /* min-elements */
        limit = ((struct lys_node_leaflist *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_leaflist *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }
        break;
    default:
        /* we cannot get here */
        assert(0);
        break;
    }

    return EXIT_SUCCESS;
}